

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

optional<bool> __thiscall
node::anon_unknown_2::ChainImpl::blockFilterMatchesAny
          (ChainImpl *this,BlockFilterType filter_type,uint256 *block_hash,ElementSet *filter_set)

{
  bool bVar1;
  _Optional_payload_base<bool> _Var2;
  BlockFilterIndex *this_00;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  CBlockIndex *block_index;
  ushort uVar4;
  ushort uVar5;
  long in_FS_OFFSET;
  BlockFilter filter;
  Params local_b8;
  BlockFilter local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetBlockFilterIndex(filter_type);
  if (this_00 == (BlockFilterIndex *)0x0) {
    _Var2._M_payload = (_Storage<bool,_true>)0x0;
    _Var2._M_engaged = false;
    goto LAB_0025d339;
  }
  local_a0.m_filter_type = INVALID;
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a0.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_b8.m_P = '\0';
  local_b8.m_siphash_k0 = 0;
  local_b8.m_siphash_k1 = 0;
  local_b8.m_M = 1;
  GCSFilter::GCSFilter(&local_a0.m_filter,&local_b8);
  local_b8.m_siphash_k0 = (uint64_t)&cs_main;
  local_b8.m_siphash_k1 = local_b8.m_siphash_k1 & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_b8);
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  block_index = BlockManager::LookupBlockIndex
                          (&((puVar3->_M_t).
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                            m_blockman,block_hash);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_b8);
  if (block_index == (CBlockIndex *)0x0) {
LAB_0025d30f:
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    bVar1 = BlockFilterIndex::LookupFilter(this_00,block_index,&local_a0);
    if (!bVar1) goto LAB_0025d30f;
    bVar1 = GCSFilter::MatchAny(&local_a0.m_filter,filter_set);
    uVar4 = (ushort)bVar1;
    uVar5 = 0x100;
  }
  if (local_a0.m_filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.m_filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.m_filter.m_encoded.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var2 = (_Optional_payload_base<bool>)(uVar5 | uVar4);
LAB_0025d339:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)_Var2;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<bool> blockFilterMatchesAny(BlockFilterType filter_type, const uint256& block_hash, const GCSFilter::ElementSet& filter_set) override
    {
        const BlockFilterIndex* block_filter_index{GetBlockFilterIndex(filter_type)};
        if (!block_filter_index) return std::nullopt;

        BlockFilter filter;
        const CBlockIndex* index{WITH_LOCK(::cs_main, return chainman().m_blockman.LookupBlockIndex(block_hash))};
        if (index == nullptr || !block_filter_index->LookupFilter(index, filter)) return std::nullopt;
        return filter.GetFilter().MatchAny(filter_set);
    }